

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O1

int GetInfoRequestRPLIDAR
              (RPLIDAR *pRPLIDAR,int *pModelID,int *pHardwareVersion,int *pFirmwareMajor,
              int *pFirmwareMinor,char *SerialNumber)

{
  int iVar1;
  ssize_t sVar2;
  char *__s;
  uint uVar3;
  long lVar4;
  uchar reqbuf [2];
  int DataType;
  int DataResponseLength;
  int SendMode;
  uchar databuf [20];
  undefined2 local_76;
  int local_74;
  int local_70 [2];
  byte local_68 [32];
  uint *local_48;
  uint *local_40;
  uint *local_38;
  
  local_76 = 0x50a5;
  uVar3 = 0;
  local_70[0] = 0;
  local_70[1] = 0;
  local_74 = 0;
  iVar1 = (pRPLIDAR->RS232Port).DevType;
  __s = "Error writing data to a RPLIDAR. ";
  if (iVar1 - 1U < 4) {
    iVar1 = (pRPLIDAR->RS232Port).s;
    local_48 = (uint *)pFirmwareMinor;
    local_40 = (uint *)pFirmwareMajor;
    local_38 = (uint *)pHardwareVersion;
    do {
      sVar2 = send(iVar1,(void *)((long)&local_76 + (ulong)uVar3),(long)(int)(2 - uVar3),0);
      if ((int)sVar2 < 1) goto LAB_001aa3fe;
      uVar3 = uVar3 + (int)sVar2;
    } while ((int)uVar3 < 2);
  }
  else {
    if (iVar1 != 0) goto LAB_001aa3fe;
    iVar1 = *(int *)&(pRPLIDAR->RS232Port).hDev;
    uVar3 = 0;
    local_48 = (uint *)pFirmwareMinor;
    local_40 = (uint *)pFirmwareMajor;
    local_38 = (uint *)pHardwareVersion;
    do {
      sVar2 = write(iVar1,(void *)((long)&local_76 + (ulong)uVar3),(ulong)(2 - uVar3));
      if ((int)sVar2 < 1) goto LAB_001aa3fe;
      uVar3 = uVar3 + (int)sVar2;
    } while (uVar3 < 2);
  }
  iVar1 = GetResponseDescriptorRPLIDAR(pRPLIDAR,local_70,local_70 + 1,&local_74);
  if (iVar1 != 0) {
    return 1;
  }
  __s = "A RPLIDAR is not responding correctly : Bad response descriptor. ";
  if ((local_70[0] == 0x14) && (local_74 == 4)) {
    local_68[0] = 0;
    local_68[1] = 0;
    local_68[2] = 0;
    local_68[3] = 0;
    local_68[4] = 0;
    local_68[5] = 0;
    local_68[6] = 0;
    local_68[7] = 0;
    local_68[8] = 0;
    local_68[9] = 0;
    local_68[10] = 0;
    local_68[0xb] = 0;
    local_68[0xc] = 0;
    local_68[0xd] = 0;
    local_68[0xe] = 0;
    local_68[0xf] = 0;
    local_68[0x10] = 0;
    local_68[0x11] = 0;
    local_68[0x12] = 0;
    local_68[0x13] = 0;
    iVar1 = (pRPLIDAR->RS232Port).DevType;
    __s = "A RPLIDAR is not responding correctly. ";
    if (iVar1 - 1U < 4) {
      iVar1 = (pRPLIDAR->RS232Port).s;
      uVar3 = 0;
      do {
        sVar2 = recv(iVar1,local_68 + uVar3,(long)(int)(0x14 - uVar3),0);
        if ((int)sVar2 < 1) goto LAB_001aa3fe;
        uVar3 = uVar3 + (int)sVar2;
      } while ((int)uVar3 < 0x14);
    }
    else {
      if (iVar1 != 0) goto LAB_001aa3fe;
      iVar1 = *(int *)&(pRPLIDAR->RS232Port).hDev;
      uVar3 = 0;
      do {
        sVar2 = read(iVar1,local_68 + uVar3,(ulong)(0x14 - uVar3));
        if ((int)sVar2 < 1) goto LAB_001aa3fe;
        uVar3 = uVar3 + (int)sVar2;
      } while (uVar3 < 0x14);
    }
    *pModelID = (uint)local_68[0];
    *local_48 = (uint)local_68[1];
    *local_40 = (uint)local_68[2];
    *local_38 = (uint)local_68[3];
    SerialNumber[0x10] = '\0';
    SerialNumber[0x11] = '\0';
    SerialNumber[0x12] = '\0';
    SerialNumber[0x13] = '\0';
    SerialNumber[0x14] = '\0';
    SerialNumber[0x15] = '\0';
    SerialNumber[0x16] = '\0';
    SerialNumber[0x17] = '\0';
    SerialNumber[0x18] = '\0';
    SerialNumber[0x19] = '\0';
    SerialNumber[0x1a] = '\0';
    SerialNumber[0x1b] = '\0';
    SerialNumber[0x1c] = '\0';
    SerialNumber[0x1d] = '\0';
    SerialNumber[0x1e] = '\0';
    SerialNumber[0x1f] = '\0';
    SerialNumber[0] = '\0';
    SerialNumber[1] = '\0';
    SerialNumber[2] = '\0';
    SerialNumber[3] = '\0';
    SerialNumber[4] = '\0';
    SerialNumber[5] = '\0';
    SerialNumber[6] = '\0';
    SerialNumber[7] = '\0';
    SerialNumber[8] = '\0';
    SerialNumber[9] = '\0';
    SerialNumber[10] = '\0';
    SerialNumber[0xb] = '\0';
    SerialNumber[0xc] = '\0';
    SerialNumber[0xd] = '\0';
    SerialNumber[0xe] = '\0';
    SerialNumber[0xf] = '\0';
    SerialNumber[0x20] = '\0';
    lVar4 = 0;
    do {
      sprintf(SerialNumber,"%02X",(ulong)local_68[lVar4 + 4]);
      lVar4 = lVar4 + 1;
      SerialNumber = SerialNumber + 2;
    } while (lVar4 != 0x10);
    return 0;
  }
LAB_001aa3fe:
  puts(__s);
  return 1;
}

Assistant:

inline int GetInfoRequestRPLIDAR(RPLIDAR* pRPLIDAR, int* pModelID, int* pHardwareVersion, int* pFirmwareMajor, int* pFirmwareMinor, char* SerialNumber)
{
	int i = 0;

#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
    sl_lidar_response_device_info_t devinfo;

	if (SL_IS_FAIL(pRPLIDAR->drv->getDeviceInfo(devinfo)))
	{
		printf("A RPLIDAR is not responding correctly : getDeviceInfo() failed. \n");
		return EXIT_FAILURE;
	}

	// Analyze the data response.
	*pModelID = devinfo.model;
	*pFirmwareMinor = (devinfo.firmware_version & 0x00FF);
	*pFirmwareMajor = (devinfo.firmware_version >> 8);
	*pHardwareVersion = devinfo.hardware_version;

	// 128bit unique serial number, when converting to text in hex, the Least Significant Byte prints first.
	memset(SerialNumber, 0, MAX_BUF_LEN_SERIAL_NUMBER_RPLIDAR);
	for (i = 0; i < NB_BYTES_SERIAL_NUMBER_RPLIDAR; i++)
	{
		sprintf(SerialNumber+2*i, "%02X", (int)(unsigned char)devinfo.serialnum[i]);
	}
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,GET_INFO_REQUEST_RPLIDAR};
	unsigned char databuf[20];
	int DataResponseLength = 0, SendMode = 0, DataType = 0;

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	// Receive the response descriptor.
	if (GetResponseDescriptorRPLIDAR(pRPLIDAR, &DataResponseLength, &SendMode, &DataType) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Quick check of the response descriptor.
	if ((DataResponseLength != 20)||(DataType != DEVINFO_RESPONSE_RPLIDAR))
	{ 
		printf("A RPLIDAR is not responding correctly : Bad response descriptor. \n");
		return EXIT_FAILURE;	
	}

	// Receive the data response.
	memset(databuf, 0, sizeof(databuf));
	if (ReadAllRS232Port(&pRPLIDAR->RS232Port, databuf, sizeof(databuf)) != EXIT_SUCCESS)
	{ 
		printf("A RPLIDAR is not responding correctly. \n");
		return EXIT_FAILURE;	
	}

	// Analyze the data response.
	*pModelID = databuf[0];
	*pFirmwareMinor = databuf[1];
	*pFirmwareMajor = databuf[2];
	*pHardwareVersion = databuf[3];

	// 128bit unique serial number, when converting to text in hex, the Least Significant Byte prints first.
	memset(SerialNumber, 0, MAX_BUF_LEN_SERIAL_NUMBER_RPLIDAR);
	for (i = 0; i < NB_BYTES_SERIAL_NUMBER_RPLIDAR; i++)
	{
		sprintf(SerialNumber+2*i, "%02X", (int)(unsigned char)databuf[i+4]);
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}